

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O2

void __thiscall
slang::SVInt::writeTo
          (SVInt *this,SmallVectorBase<char> *buffer,LiteralBase base,bool includeBase,
          bitwidth_t abbreviateThresholdBits)

{
  ulong *puVar1;
  uint64_t *puVar2;
  int iVar3;
  bool bVar4;
  logic_t lVar5;
  bitwidth_t bVar6;
  uint uVar7;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 aVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  bitwidth_t bVar12;
  ulong uVar13;
  SmallVectorBase<char> *pSVar14;
  SVInt *pSVar15;
  uint32_t value;
  LiteralBase LVar16;
  double dVar17;
  double __x;
  double __y;
  optional<unsigned_long> oVar18;
  char local_99;
  SmallVectorBase<char> *local_98;
  SVInt *local_90;
  anon_class_24_3_ec93f8c0 all;
  size_type *local_70;
  size_type local_68;
  SVInt tmp;
  uint32_t words;
  undefined4 uStack_4c;
  bitwidth_t local_48;
  undefined2 local_44;
  uint64_t mask;
  bitwidth_t local_38;
  undefined2 local_34;
  
  SVInt(&tmp,&this->super_SVIntStorage);
  local_90 = this;
  if ((((this->super_SVIntStorage).signFlag == true) &&
      ((this->super_SVIntStorage).unknownFlag == false)) && (bVar4 = isNegative(this), bVar4)) {
    operator-((SVInt *)&all);
    operator=(&tmp,(SVInt *)&all);
    ~SVInt((SVInt *)&all);
    all.words = (uint32_t *)CONCAT71(all.words._1_7_,0x2d);
    SmallVectorBase<char>::emplace_back<char>(buffer,(char *)&all);
  }
  local_98 = buffer;
  bVar6 = getActiveBits(&tmp);
  LVar16 = Decimal;
  if (bVar6 <= abbreviateThresholdBits) {
    LVar16 = base;
  }
  bVar12 = 1;
  uVar9 = 7;
  if (abbreviateThresholdBits < bVar6 || includeBase) {
    uintToStr(local_98,(local_90->super_SVIntStorage).bitWidth);
    all.words = (uint32_t *)CONCAT71(all.words._1_7_,0x27);
    SmallVectorBase<char>::emplace_back<char>(local_98,(char *)&all);
    if ((local_90->super_SVIntStorage).signFlag == true) {
      all.words = (uint32_t *)CONCAT71(all.words._1_7_,0x73);
      SmallVectorBase<char>::emplace_back<char>(local_98,(char *)&all);
    }
    pSVar14 = local_98;
    switch(LVar16) {
    case Binary:
      all.words = (uint32_t *)CONCAT71(all.words._1_7_,0x62);
      SmallVectorBase<char>::emplace_back<char>(local_98,(char *)&all);
      local_70 = &pSVar14->len;
      local_68 = pSVar14->len;
      break;
    case Octal:
      all.words = (uint32_t *)CONCAT71(all.words._1_7_,0x6f);
      SmallVectorBase<char>::emplace_back<char>(local_98,(char *)&all);
      local_70 = &pSVar14->len;
      local_68 = pSVar14->len;
      goto switchD_00173108_caseD_1;
    case Decimal:
      all.words = (uint32_t *)CONCAT71(all.words._1_7_,100);
      SmallVectorBase<char>::emplace_back<char>(local_98,(char *)&all);
      local_70 = &pSVar14->len;
      local_68 = pSVar14->len;
      goto switchD_00173108_caseD_2;
    case Hex:
      all.words = (uint32_t *)CONCAT71(all.words._1_7_,0x68);
      SmallVectorBase<char>::emplace_back<char>(local_98,(char *)&all);
      local_70 = &pSVar14->len;
      local_68 = pSVar14->len;
      goto switchD_00173108_caseD_3;
    default:
      goto switchD_001730b2_default;
    }
switchD_00173108_caseD_0:
    uVar9 = 1;
  }
  else {
switchD_001730b2_default:
    local_70 = &local_98->len;
    local_68 = local_98->len;
    switch(LVar16) {
    case Binary:
      goto switchD_00173108_caseD_0;
    case Octal:
switchD_00173108_caseD_1:
      bVar12 = 3;
      break;
    case Decimal:
switchD_00173108_caseD_2:
      pSVar15 = local_90;
      if ((local_90->super_SVIntStorage).unknownFlag != true) {
        pSVar15 = (SVInt *)0x0;
        if (abbreviateThresholdBits <= bVar6 && bVar6 - abbreviateThresholdBits != 0) {
          local_90 = (SVInt *)log2_10;
          __y = log2_10;
          dVar17 = ceil((double)(bVar6 - abbreviateThresholdBits) / log2_10);
          uVar13 = 5;
          if (5 < (uint)(long)dVar17) {
            uVar13 = (long)dVar17;
          }
          pSVar15 = (SVInt *)(uVar13 & 0xffffffff);
          dVar17 = ceil((double)(long)pSVar15 * (double)local_90);
          SVInt((SVInt *)&all,(bitwidth_t)(long)dVar17,10,false);
          SVInt<unsigned_int,void>((SVInt *)&words,(uint)uVar13);
          pow((SVInt *)&mask,__x,__y);
          operator=((SVInt *)&all,(SVInt *)&mask);
          ~SVInt((SVInt *)&mask);
          ~SVInt((SVInt *)&words);
          mask = 0;
          local_34._0_1_ = false;
          local_34._1_1_ = false;
          _words = 0;
          local_44._0_1_ = false;
          local_44._1_1_ = false;
          local_48 = bVar12;
          local_38 = bVar12;
          divide(&tmp,(tmp.super_SVIntStorage.bitWidth + 0x3f >> 6) <<
                      (tmp.super_SVIntStorage.unknownFlag & 0x1fU),(SVInt *)&all,
                 ((int)all.this + 0x3fU >> 6) << (all.this._5_1_ & 0x1f),(SVInt *)&words,
                 (SVInt *)&mask);
          operator=(&tmp,(SVInt *)&words);
          ~SVInt((SVInt *)&words);
          ~SVInt((SVInt *)&mask);
          ~SVInt((SVInt *)&all);
        }
        local_90 = pSVar15;
        SVInt((SVInt *)&all,4,10,false);
        while( true ) {
          SVInt<int,void>((SVInt *)&mask,0);
          lVar5 = operator!=(&tmp,(SVInt *)&mask);
          ~SVInt((SVInt *)&mask);
          if (((lVar5.value == '\0') || (lVar5.value == '@')) || (lVar5.value == 0x80)) break;
          mask = 0;
          local_34._0_1_ = false;
          local_34._1_1_ = false;
          _words = 0;
          local_44._0_1_ = false;
          local_44._1_1_ = false;
          local_48 = bVar12;
          local_38 = bVar12;
          divide(&tmp,(tmp.super_SVIntStorage.bitWidth + 0x3f >> 6) <<
                      (tmp.super_SVIntStorage.unknownFlag & 0x1fU),(SVInt *)&all,
                 ((int)all.this + 0x3fU >> 6) << (all.this._5_1_ & 0x1f),(SVInt *)&words,
                 (SVInt *)&mask);
          oVar18 = as<unsigned_long,void>((SVInt *)&mask);
          if (((undefined1  [16])
               oVar18.super__Optional_base<unsigned_long,_true,_true>._M_payload.
               super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) ==
              (undefined1  [16])0x0) {
            std::__throw_bad_optional_access();
          }
          if (9 < oVar18.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_long>._M_payload) {
            assert::assertFailed
                      ("digit < 10",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/numeric/SVInt.cpp"
                       ,0x30c,
                       "void slang::SVInt::writeTo(SmallVectorBase<char> &, LiteralBase, bool, bitwidth_t) const"
                      );
          }
          SmallVectorBase<char>::emplace_back<char_const&>
                    (local_98,"0123456789abcdef" +
                              oVar18.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                              super__Optional_payload_base<unsigned_long>._M_payload);
          operator=(&tmp,(SVInt *)&words);
          ~SVInt((SVInt *)&words);
          ~SVInt((SVInt *)&mask);
        }
        ~SVInt((SVInt *)&all);
        value = (uint32_t)local_90;
        pSVar14 = local_98;
        goto LAB_00173615;
      }
      uVar9 = (local_90->super_SVIntStorage).bitWidth;
      uVar7 = uVar9 + 0x3f >> 6;
      all.words = &words;
      words = uVar7;
      uVar9 = uVar9 & 0x3f;
      uVar13 = -(ulong)(uVar9 == 0) | ~(-1L << (sbyte)uVar9);
      all.mask = &mask;
      all.this = local_90;
      mask = uVar13;
      bVar4 = writeTo::anon_class_24_3_ec93f8c0::operator()(&all,uVar7,0xffffffffffffffff);
      if (bVar4) {
        bVar4 = writeTo::anon_class_24_3_ec93f8c0::operator()(&all,0,0xffffffffffffffff);
        pSVar14 = local_98;
        if (bVar4) {
          local_99 = 'z';
          SmallVectorBase<char>::emplace_back<char>(local_98,&local_99);
        }
        else {
          bVar4 = writeTo::anon_class_24_3_ec93f8c0::operator()(&all,0,0);
          pSVar14 = local_98;
          if (!bVar4) goto LAB_001736b1;
          local_99 = 'x';
          SmallVectorBase<char>::emplace_back<char>(local_98,&local_99);
        }
      }
      else {
LAB_001736b1:
        pSVar14 = local_98;
        puVar2 = (pSVar15->super_SVIntStorage).field_0.pVal;
        uVar11 = 0;
        do {
          if (uVar7 - 1 == uVar11) {
            if ((~puVar2[uVar7 - 1] & puVar2[uVar7 * 2 - 1] & uVar13) == 0) {
              local_99 = 'Z';
              SmallVectorBase<char>::emplace_back<char>(local_98,&local_99);
              goto LAB_00173703;
            }
            break;
          }
          puVar1 = puVar2 + uVar11;
          iVar3 = (int)uVar11;
          uVar11 = uVar11 + 1;
        } while ((puVar2[uVar7 + iVar3] & ~*puVar1) == 0);
        local_99 = 'X';
        SmallVectorBase<char>::emplace_back<char>(local_98,&local_99);
      }
LAB_00173703:
      value = 0;
      goto LAB_00173615;
    case Hex:
switchD_00173108_caseD_3:
      bVar12 = 4;
      uVar9 = 0xf;
      break;
    default:
      bVar12 = 0;
      uVar9 = 0;
    }
  }
  bVar6 = tmp.super_SVIntStorage.bitWidth;
  SVInt<int,void>((SVInt *)&all,0);
  lVar5 = operator!=(&tmp,(SVInt *)&all);
  while (((~SVInt((SVInt *)&all), lVar5.value != 0x40 && (lVar5.value & 0x7f) != 0 ||
          (lVar5.value == 0x80)) || (lVar5.value == 0x40))) {
    if ((int)bVar6 < (int)bVar12) {
      uVar9 = ~(-1 << ((byte)bVar6 & 0x1f));
    }
    aVar8.pVal = (uint64_t *)&tmp;
    if ((tmp.super_SVIntStorage.unknownFlag & 1U) != 0) {
      aVar8 = tmp.super_SVIntStorage.field_0;
    }
    if (0x40 < tmp.super_SVIntStorage.bitWidth) {
      aVar8 = tmp.super_SVIntStorage.field_0;
    }
    uVar7 = (uint)*aVar8.pVal & uVar9;
    if ((tmp.super_SVIntStorage.unknownFlag & 1U) == 0) {
      SmallVectorBase<char>::emplace_back<char_const&>(local_98,"0123456789abcdef" + uVar7);
    }
    else {
      uVar10 = (uint)tmp.super_SVIntStorage.field_0.pVal
                     [(local_90->super_SVIntStorage).bitWidth + 0x3f >> 6] & uVar9;
      if (uVar10 == 0) {
        SmallVectorBase<char>::emplace_back<char_const&>(local_98,"0123456789abcdef" + uVar7);
      }
      else if ((uVar10 == uVar9) && (uVar7 == 0)) {
        all.words = (uint32_t *)CONCAT71(all.words._1_7_,0x78);
        SmallVectorBase<char>::emplace_back<char>(local_98,(char *)&all);
      }
      else if ((uVar10 == uVar9) && (uVar7 == uVar9)) {
        all.words = (uint32_t *)CONCAT71(all.words._1_7_,0x7a);
        SmallVectorBase<char>::emplace_back<char>(local_98,(char *)&all);
      }
      else if ((uVar10 & ~uVar7) == 0) {
        all.words = (uint32_t *)CONCAT71(all.words._1_7_,0x5a);
        SmallVectorBase<char>::emplace_back<char>(local_98,(char *)&all);
      }
      else {
        all.words = (uint32_t *)CONCAT71(all.words._1_7_,0x58);
        SmallVectorBase<char>::emplace_back<char>(local_98,(char *)&all);
      }
    }
    lshr((SVInt *)&all,(bitwidth_t)&tmp);
    operator=(&tmp,(SVInt *)&all);
    ~SVInt((SVInt *)&all);
    SVInt<int,void>((SVInt *)&all,0);
    lVar5 = operator!=(&tmp,(SVInt *)&all);
    bVar6 = bVar6 - bVar12;
  }
  value = 0;
  pSVar14 = local_98;
LAB_00173615:
  if (local_68 == *local_70) {
    all.words = (uint32_t *)CONCAT71(all.words._1_7_,0x30);
    SmallVectorBase<char>::emplace_back<char>(pSVar14,(char *)&all);
  }
  else {
    std::__reverse<char*>(pSVar14->data_ + local_68,pSVar14->data_ + *local_70);
    if (value != 0) {
      all.words = (uint32_t *)0x4;
      all.this = (SVInt *)anon_var_dwarf_1a41f6;
      SmallVectorBase<char>::append<std::basic_string_view<char,std::char_traits<char>>>
                (pSVar14,(basic_string_view<char,_std::char_traits<char>_> *)&all);
      uintToStr(pSVar14,value);
    }
  }
  ~SVInt(&tmp);
  return;
}

Assistant:

void SVInt::writeTo(SmallVectorBase<char>& buffer, LiteralBase base, bool includeBase,
                    bitwidth_t abbreviateThresholdBits) const {
    // negative sign if necessary
    SVInt tmp(*this);
    if (signFlag && !unknownFlag && isNegative()) {
        tmp = -tmp;
        buffer.push_back('-');
    }

    // If the number is larger than the threshold to abbreviate,
    // force it to print as a decimal.
    bitwidth_t activeBits = tmp.getActiveBits();
    if (activeBits > abbreviateThresholdBits) {
        includeBase = true;
        base = LiteralBase::Decimal;
    }

    if (includeBase) {
        uintToStr(buffer, bitWidth);
        buffer.push_back('\'');
        if (signFlag)
            buffer.push_back('s');
        switch (base) {
            case LiteralBase::Binary:
                buffer.push_back('b');
                break;
            case LiteralBase::Octal:
                buffer.push_back('o');
                break;
            case LiteralBase::Decimal:
                buffer.push_back('d');
                break;
            case LiteralBase::Hex:
                buffer.push_back('h');
                break;
        }
    }

    uint32_t base10Exponent = 0;
    size_t startOffset = buffer.size();
    static const char Digits[] = "0123456789abcdef";
    if (base == LiteralBase::Decimal) {
        // decimal numbers that have unknown values only print as a single letter,
        // with the following rules:
        // - If all bits are unknown, print 'x'
        // - If all bits are high impendance, print 'z'
        // - If some bits are unknown, print 'X'
        // - Otherwise, if some bits are high impedance , print 'Z'
        if (unknownFlag) {
            uint64_t mask;
            bitwidth_t bitsInMsw;
            uint32_t words = getNumWords(bitWidth, false);
            getTopWordMask(bitsInMsw, mask);

            auto all = [&](uint32_t start, uint64_t v) {
                for (uint32_t i = 0; i < words - 1; i++) {
                    if (pVal[start + i] != v)
                        return false;
                }

                return pVal[start + words - 1] == (mask & v);
            };

            auto anyXs = [&]() {
                for (uint32_t i = 0; i < words - 1; i++) {
                    if ((~pVal[i] & pVal[i + words]) != 0)
                        return true;
                }

                return (~pVal[words - 1] & mask & pVal[words * 2 - 1]) != 0;
            };

            bool upperOnes = all(words, UINT64_MAX);
            if (upperOnes && all(0, UINT64_MAX))
                buffer.push_back('z');
            else if (upperOnes && all(0, 0))
                buffer.push_back('x');
            else if (anyXs())
                buffer.push_back('X');
            else
                buffer.push_back('Z');
        }
        else {
            // Limit the size of the output string based on the given threshold.
            if (activeBits > abbreviateThresholdBits) {
                base10Exponent =
                    std::max(5u, (uint32_t)ceil((activeBits - abbreviateThresholdBits) / log2_10));
                SVInt divisor(bitwidth_t(ceil(base10Exponent * log2_10)), 10, false);
                divisor = divisor.pow(base10Exponent);

                SVInt remainder;
                SVInt quotient;
                divide(tmp, tmp.getNumWords(), divisor, divisor.getNumWords(), &quotient,
                       &remainder);
                tmp = quotient;
            }

            // repeatedly divide by 10 to get each digit
            SVInt divisor(4, 10, false);
            while (tmp != 0) {
                SVInt remainder;
                SVInt quotient;
                divide(tmp, tmp.getNumWords(), divisor, divisor.getNumWords(), &quotient,
                       &remainder);
                uint64_t digit = remainder.as<uint64_t>().value();
                ASSERT(digit < 10);
                buffer.push_back(Digits[digit]);
                tmp = quotient;
            }
        }
    }
    else {
        // for bases 2, 8, and 16 we can just shift instead of dividing
        uint32_t shiftAmount = 0;
        uint32_t maskAmount = 0;
        switch (base) {
            case LiteralBase::Binary:
                shiftAmount = 1;
                maskAmount = 1;
                break;
            case LiteralBase::Octal:
                shiftAmount = 3;
                maskAmount = 7;
                break;
            case LiteralBase::Hex:
                shiftAmount = 4;
                maskAmount = 15;
                break;
            case LiteralBase::Decimal:
                ASSUME_UNREACHABLE;
        }

        // if we have unknown values here, the comparison will return X
        // we want to keep going so that we print the unknowns
        int bitsLeft = int(tmp.getBitWidth());
        logic_t x = tmp != 0;
        while (x || x.isUnknown()) {
            if (bitsLeft < int(shiftAmount))
                maskAmount = (1 << bitsLeft) - 1;

            uint32_t digit = uint32_t(tmp.getRawData()[0]) & maskAmount;
            if (!tmp.unknownFlag)
                buffer.push_back(Digits[digit]);
            else {
                uint32_t u = uint32_t(tmp.pVal[getNumWords(bitWidth, false)]) & maskAmount;
                if (!u)
                    buffer.push_back(Digits[digit]);
                else if (u == maskAmount && (digit & maskAmount) == 0)
                    buffer.push_back('x');
                else if (u == maskAmount && digit == maskAmount)
                    buffer.push_back('z');
                else if (~digit & u)
                    buffer.push_back('X');
                else
                    buffer.push_back('Z');
            }
            // this shift might shift away the unknown digits, at which point
            // it converts back to being a normal 2-state value
            tmp = tmp.lshr(shiftAmount);
            bitsLeft -= int(shiftAmount);
            x = tmp != 0;
        }
    }

    // no digits means this is zero
    if (startOffset == buffer.size())
        buffer.push_back('0');
    else {
        // reverse the digits
        std::reverse(buffer.begin() + startOffset, buffer.end());
        if (base10Exponent > 0) {
            buffer.append("...e"sv);
            uintToStr(buffer, base10Exponent);
        }
    }
}